

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.cpp
# Opt level: O3

index_type * cmrc::whence_prefix::(anonymous_namespace)::get_root_index_abi_cxx11_(void)

{
  directory *pdVar1;
  int iVar2;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmrc::detail::file_or_directory_*>_>
  _Var3;
  _Base_ptr extraout_RAX;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmrc::detail::file_or_directory_*>_>,_bool>
  pVar4;
  created_subdirectory cVar5;
  created_subdirectory cVar6;
  file_or_directory *local_78;
  string local_70;
  string local_50;
  string local_30;
  
  if (get_root_index[abi:cxx11]()::root_directory_ == '\0') {
    get_root_index_abi_cxx11_();
  }
  if (get_root_index[abi:cxx11]()::root_directory_fod == '\0') {
    get_root_index_abi_cxx11_();
  }
  if (get_root_index[abi:cxx11]()::root_index_abi_cxx11_ == '\0') {
    get_root_index_abi_cxx11_();
  }
  local_78 = &anon_unknown_1::get_root_index::root_directory_fod;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>>
  ::_M_emplace_unique<char_const(&)[1],cmrc::detail::file_or_directory*>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>>
              *)&get_root_index[abi:cxx11]()::root_index_abi_cxx11_,(char (*) [1])0x104058,&local_78
            );
  if (get_root_index[abi:cxx11]()::f_bd13_imaginary_prefix_dir == '\0') {
    iVar2 = __cxa_guard_acquire(&get_root_index[abi:cxx11]()::f_bd13_imaginary_prefix_dir);
    if (iVar2 != 0) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"imaginary-prefix","");
      cVar5 = detail::directory::add_subdir
                        (&anon_unknown_1::get_root_index::root_directory_,&local_30);
      _ZZN4cmrc13whence_prefix12_GLOBAL__N_114get_root_indexB5cxx11EvE27f_bd13_imaginary_prefix_dir_1
           = cVar5.index_entry;
      _ZZN4cmrc13whence_prefix12_GLOBAL__N_114get_root_indexB5cxx11EvE27f_bd13_imaginary_prefix_dir_0
           = cVar5.directory;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
        cVar5.index_entry =
             _ZZN4cmrc13whence_prefix12_GLOBAL__N_114get_root_indexB5cxx11EvE27f_bd13_imaginary_prefix_dir_1
        ;
        cVar5.directory =
             _ZZN4cmrc13whence_prefix12_GLOBAL__N_114get_root_indexB5cxx11EvE27f_bd13_imaginary_prefix_dir_0
        ;
      }
      _ZZN4cmrc13whence_prefix12_GLOBAL__N_114get_root_indexB5cxx11EvE27f_bd13_imaginary_prefix_dir_1
           = cVar5.index_entry;
      _ZZN4cmrc13whence_prefix12_GLOBAL__N_114get_root_indexB5cxx11EvE27f_bd13_imaginary_prefix_dir_0
           = cVar5.directory;
      __cxa_guard_release(&get_root_index[abi:cxx11]()::f_bd13_imaginary_prefix_dir);
    }
  }
  local_78 = 
  _ZZN4cmrc13whence_prefix12_GLOBAL__N_114get_root_indexB5cxx11EvE27f_bd13_imaginary_prefix_dir_1;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>>
  ::_M_emplace_unique<char_const(&)[17],cmrc::detail::file_or_directory*>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>>
              *)&get_root_index[abi:cxx11]()::root_index_abi_cxx11_,
             (char (*) [17])"imaginary-prefix",&local_78);
  if (get_root_index[abi:cxx11]()::f_c78b_imaginary_prefix_subdir_b_dir == '\0') {
    iVar2 = __cxa_guard_acquire(&get_root_index[abi:cxx11]()::f_c78b_imaginary_prefix_subdir_b_dir);
    pdVar1 = 
    _ZZN4cmrc13whence_prefix12_GLOBAL__N_114get_root_indexB5cxx11EvE27f_bd13_imaginary_prefix_dir_0;
    if (iVar2 != 0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"subdir_b","");
      cVar6 = detail::directory::add_subdir(pdVar1,&local_50);
      _ZZN4cmrc13whence_prefix12_GLOBAL__N_114get_root_indexB5cxx11EvE36f_c78b_imaginary_prefix_subdir_b_dir_1
           = cVar6.index_entry;
      _ZZN4cmrc13whence_prefix12_GLOBAL__N_114get_root_indexB5cxx11EvE36f_c78b_imaginary_prefix_subdir_b_dir_0
           = cVar6.directory;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        cVar6.index_entry =
             _ZZN4cmrc13whence_prefix12_GLOBAL__N_114get_root_indexB5cxx11EvE36f_c78b_imaginary_prefix_subdir_b_dir_1
        ;
        cVar6.directory =
             _ZZN4cmrc13whence_prefix12_GLOBAL__N_114get_root_indexB5cxx11EvE36f_c78b_imaginary_prefix_subdir_b_dir_0
        ;
      }
      _ZZN4cmrc13whence_prefix12_GLOBAL__N_114get_root_indexB5cxx11EvE36f_c78b_imaginary_prefix_subdir_b_dir_1
           = cVar6.index_entry;
      _ZZN4cmrc13whence_prefix12_GLOBAL__N_114get_root_indexB5cxx11EvE36f_c78b_imaginary_prefix_subdir_b_dir_0
           = cVar6.directory;
      __cxa_guard_release(&get_root_index[abi:cxx11]()::f_c78b_imaginary_prefix_subdir_b_dir);
    }
  }
  local_78 = 
  _ZZN4cmrc13whence_prefix12_GLOBAL__N_114get_root_indexB5cxx11EvE36f_c78b_imaginary_prefix_subdir_b_dir_1
  ;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>>
  ::_M_emplace_unique<char_const(&)[26],cmrc::detail::file_or_directory*>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>>
              *)&get_root_index[abi:cxx11]()::root_index_abi_cxx11_,
             (char (*) [26])"imaginary-prefix/subdir_b",&local_78);
  pdVar1 = 
  _ZZN4cmrc13whence_prefix12_GLOBAL__N_114get_root_indexB5cxx11EvE36f_c78b_imaginary_prefix_subdir_b_dir_0
  ;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"file_b.txt","");
  local_78 = detail::directory::add_file(pdVar1,&local_70,"I am a file!","");
  pVar4 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>>
          ::_M_emplace_unique<char_const(&)[37],cmrc::detail::file_or_directory*>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>>
                      *)&get_root_index[abi:cxx11]()::root_index_abi_cxx11_,
                     (char (*) [37])"imaginary-prefix/subdir_b/file_b.txt",&local_78);
  _Var3 = pVar4.first._M_node;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    _Var3._M_node = extraout_RAX;
  }
  return (index_type *)_Var3._M_node;
}

Assistant:

const cmrc::detail::index_type&
get_root_index() {
    static cmrc::detail::directory root_directory_;
    static cmrc::detail::file_or_directory root_directory_fod{root_directory_};
    static cmrc::detail::index_type root_index;
    root_index.emplace("", &root_directory_fod);
    struct dir_inl {
        class cmrc::detail::directory& directory;
    };
    dir_inl root_directory_dir{root_directory_};
    (void)root_directory_dir;
    static auto f_bd13_imaginary_prefix_dir = root_directory_dir.directory.add_subdir("imaginary-prefix");
    root_index.emplace("imaginary-prefix", &f_bd13_imaginary_prefix_dir.index_entry);
    static auto f_c78b_imaginary_prefix_subdir_b_dir = f_bd13_imaginary_prefix_dir.directory.add_subdir("subdir_b");
    root_index.emplace("imaginary-prefix/subdir_b", &f_c78b_imaginary_prefix_subdir_b_dir.index_entry);
    root_index.emplace(
        "imaginary-prefix/subdir_b/file_b.txt",
        f_c78b_imaginary_prefix_subdir_b_dir.directory.add_file(
            "file_b.txt",
            res_chars::f_a432_subdir_b_file_b_txt_begin,
            res_chars::f_a432_subdir_b_file_b_txt_end
        )
    );
    return root_index;
}